

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::fill(CImg<unsigned_int> *this,uint val)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  uint in_ESI;
  CImg<unsigned_int> *in_RDI;
  uint *ptrd;
  uint *local_20;
  
  bVar2 = is_empty(in_RDI);
  if (!bVar2) {
    if (in_ESI == 0) {
      puVar1 = in_RDI->_data;
      uVar3 = size(in_RDI);
      memset(puVar1,0,(ulong)uVar3 << 2);
    }
    else {
      puVar1 = in_RDI->_data;
      uVar3 = size(in_RDI);
      local_20 = puVar1 + uVar3;
      while (in_RDI->_data < local_20) {
        local_20[-1] = in_ESI;
        local_20 = local_20 + -1;
      }
    }
  }
  return in_RDI;
}

Assistant:

CImg<T>& fill(const T val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)val,size()*sizeof(T));
      return *this;
    }